

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void CPP::writeResourceIcon
               (QTextStream *output,QString *iconName,QString *indent,DomResourceIcon *i)

{
  long lVar1;
  bool bVar2;
  DomResourceIcon *in_RCX;
  QString *in_RDX;
  QTextStream *in_RSI;
  DomResourcePixmap *in_RDI;
  long in_FS_OFFSET;
  DomResourcePixmap *in_stack_fffffffffffffe58;
  DomResourcePixmap *in_stack_fffffffffffffe70;
  QString *in_stack_fffffffffffffe78;
  QTextStream *in_stack_fffffffffffffe80;
  DomResourcePixmap *in_stack_fffffffffffffe88;
  QString *in_stack_fffffffffffffe90;
  QTextStream *in_stack_fffffffffffffe98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DomResourceIcon::hasElementNormalOff(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementNormalOff(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d41b);
  }
  bVar2 = DomResourceIcon::hasElementNormalOn(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementNormalOn(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d4be);
  }
  bVar2 = DomResourceIcon::hasElementDisabledOff(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementDisabledOff(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d55b);
  }
  bVar2 = DomResourceIcon::hasElementDisabledOn(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementDisabledOn(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d5e9);
  }
  bVar2 = DomResourceIcon::hasElementActiveOff(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementActiveOff(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d677);
  }
  bVar2 = DomResourceIcon::hasElementActiveOn(in_RCX);
  if (bVar2) {
    in_stack_fffffffffffffe88 = in_RDI;
    in_stack_fffffffffffffe90 = in_RDX;
    in_stack_fffffffffffffe98 = in_RSI;
    DomResourceIcon::elementActiveOn(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d705);
  }
  bVar2 = DomResourceIcon::hasElementSelectedOff(in_RCX);
  if (bVar2) {
    in_stack_fffffffffffffe70 = in_RDI;
    DomResourceIcon::elementSelectedOff(in_RCX);
    DomResourcePixmap::text(in_stack_fffffffffffffe58);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_RSI,(char *)in_RDX,
                     (char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d793);
    in_stack_fffffffffffffe78 = in_RDX;
    in_stack_fffffffffffffe80 = in_RSI;
  }
  bVar2 = DomResourceIcon::hasElementSelectedOn(in_RCX);
  if (bVar2) {
    DomResourceIcon::elementSelectedOn(in_RCX);
    DomResourcePixmap::text(in_RDI);
    writeIconAddFile(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     &in_stack_fffffffffffffe88->m_text,(QString *)in_stack_fffffffffffffe80,
                     (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x13d81f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void writeResourceIcon(QTextStream &output,
                              const QString &iconName,
                              const QString &indent,
                              const DomResourceIcon *i)
{
    if (i->hasElementNormalOff()) {
        writeIconAddFile(output, indent, iconName, i->elementNormalOff()->text(),
                         "Normal", "Off");
    }
    if (i->hasElementNormalOn()) {
        writeIconAddFile(output, indent, iconName, i->elementNormalOn()->text(),
                         "Normal", "On");
    }
    if (i->hasElementDisabledOff()) {
        writeIconAddFile(output, indent, iconName, i->elementDisabledOff()->text(),
                         "Disabled", "Off");
    }
    if (i->hasElementDisabledOn()) {
        writeIconAddFile(output, indent, iconName, i->elementDisabledOn()->text(),
                         "Disabled", "On");
    }
    if (i->hasElementActiveOff()) {
        writeIconAddFile(output, indent, iconName, i->elementActiveOff()->text(),
                         "Active", "Off");
    }
    if (i->hasElementActiveOn()) {
        writeIconAddFile(output, indent, iconName, i->elementActiveOn()->text(),
                         "Active", "On");
    }
    if (i->hasElementSelectedOff()) {
        writeIconAddFile(output, indent, iconName, i->elementSelectedOff()->text(),
                         "Selected", "Off");
    }
    if (i->hasElementSelectedOn()) {
        writeIconAddFile(output, indent, iconName, i->elementSelectedOn()->text(),
                         "Selected", "On");
    }
}